

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O0

void __thiscall LCA_Predecessors_Test::LCA_Predecessors_Test(LCA_Predecessors_Test *this)

{
  LCA_Predecessors_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__LCA_Predecessors_Test_001a2fb8;
  return;
}

Assistant:

TEST(LCA, Predecessors) {
    int n = 50;
    rep(tests, 0, 10) {
        generateTree(n);
        initLCA(0, n);
        rep(a, 0, n) {
            int cur = a;
            rep(l, 0, LOG) {
                if (pred[a][l] == -1) {
                    EXPECT_LT(d[cur], (1 << l));
                } else {
                    int move = l ? (1 << (l - 1)) : 1; // 1 1 2 4 8 ...
                    rep(i, 0, move) cur = pred[cur][0];
                    EXPECT_EQ(cur, pred[a][l]);
                }
            }
        }
    }
}